

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::clauseComparator(SelectionCompiler *this)

{
  bool bVar1;
  any floatVal;
  float val;
  Token tokenValue;
  Token tokenComparator;
  Token tokenAtomProperty;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  any *in_stack_ffffffffffffff48;
  float *__rhs;
  undefined4 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  SelectionCompiler *in_stack_ffffffffffffff80;
  int local_68;
  uint local_40;
  bool local_1;
  
  tokenNext((SelectionCompiler *)
            CONCAT17(in_stack_ffffffffffffff5f,
                     CONCAT16(in_stack_ffffffffffffff5e,
                              CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))));
  tokenNext((SelectionCompiler *)
            CONCAT17(in_stack_ffffffffffffff5f,
                     CONCAT16(in_stack_ffffffffffffff5e,
                              CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))));
  if ((local_40 & 0x2400) == 0) {
    local_1 = comparisonOperatorExpected(in_stack_ffffffffffffff80);
    goto LAB_00401591;
  }
  tokenNext((SelectionCompiler *)
            CONCAT17(in_stack_ffffffffffffff5f,
                     CONCAT16(in_stack_ffffffffffffff5e,
                              CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))));
  if ((local_68 == 2) || (local_68 == 3)) {
    std::any::type(in_stack_ffffffffffffff48);
    bVar1 = std::type_info::operator==
                      ((type_info *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (type_info *)in_stack_ffffffffffffff48);
    if (bVar1) {
      std::any_cast<int>((any *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    }
    else {
      std::any::type(in_stack_ffffffffffffff48);
      bVar1 = std::type_info::operator==
                        ((type_info *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (type_info *)in_stack_ffffffffffffff48);
      if (!bVar1) {
        local_1 = false;
        goto LAB_00401579;
      }
      in_stack_ffffffffffffff54 =
           std::any_cast<float>
                     ((any *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    }
    __rhs = (float *)&stack0xffffffffffffff80;
    std::any::any((any *)0x4014cf);
    std::any::operator=((any *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__rhs);
    Token::Token((Token *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,(any *)0x4014fd);
    local_1 = addTokenToPostfix((SelectionCompiler *)
                                CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                                (Token *)CONCAT44(in_stack_ffffffffffffff3c,
                                                  in_stack_ffffffffffffff38));
    Token::~Token((Token *)0x40152b);
    std::any::~any((any *)0x40153d);
  }
  else {
    local_1 = numberExpected(in_stack_ffffffffffffff80);
  }
LAB_00401579:
  Token::~Token((Token *)0x401583);
LAB_00401591:
  Token::~Token((Token *)0x40159e);
  Token::~Token((Token *)0x4015ab);
  return local_1;
}

Assistant:

bool SelectionCompiler::clauseComparator() {
    Token tokenAtomProperty = tokenNext();
    Token tokenComparator   = tokenNext();
    if ((tokenComparator.tok & Token::comparator) == 0) {
      return comparisonOperatorExpected();
    }

    Token tokenValue = tokenNext();
    if (tokenValue.tok != Token::integer && tokenValue.tok != Token::decimal) {
      return numberExpected();
    }

    float val;
    if (tokenValue.value.type() == typeid(int)) {
      val = std::any_cast<int>(tokenValue.value);
    } else if (tokenValue.value.type() == typeid(float)) {
      val = std::any_cast<float>(tokenValue.value);
    } else {
      return false;
    }

    std::any floatVal;
    floatVal = val;
    return addTokenToPostfix(
        Token(tokenComparator.tok, tokenAtomProperty.tok, floatVal));
  }